

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O1

void __thiscall
TgBot::Api::setWebhook
          (Api *this,string *url,Ptr *certificate,int32_t maxConnection,
          StringArrayPtr *allowedUpdates)

{
  element_type *__args_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *objects;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  string allowedUpdatesJson;
  int32_t local_ac;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_a8;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  ptree local_48;
  
  local_a8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ac = maxConnection;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&local_a8,4);
  if (url->_M_string_length != 0) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[4],std::__cxx11::string_const&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_a8,
               (char (*) [4])0x26041b,url);
  }
  __args_1 = (certificate->super___shared_ptr<TgBot::InputFile,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (__args_1 != (element_type *)0x0) {
    local_88._M_dataplus._M_p._0_1_ = 1;
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[12],std::__cxx11::string&,bool,std::__cxx11::string&,std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_a8,
               (char (*) [12])0x2604fa,&__args_1->data,(bool *)&local_88,&__args_1->mimeType,
               &__args_1->fileName);
  }
  if (local_ac != 0x28) {
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],int&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_a8,
               (char (*) [16])"max_connections",&local_ac);
  }
  objects = (allowedUpdates->
            super___shared_ptr<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  if (objects !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    local_50 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/tgbot-cpp/src/Api.cpp:915:13)>
               ::_M_invoke;
    local_58 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/tgbot-cpp/src/Api.cpp:915:13)>
               ::_M_manager;
    TgTypeParser::parseArray<std::__cxx11::string>
              (&local_88,(TgTypeParser *)&this->field_0x28,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)&local_68,objects);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
    emplace_back<char_const(&)[16],std::__cxx11::string&>
              ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&local_a8,
               (char (*) [16])"allowed_updates",&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"setWebhook","");
  sendRequest(&local_48,this,&local_88,&local_a8);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_a8);
  return;
}

Assistant:

void Api::setWebhook(const string& url, const InputFile::Ptr certificate, int32_t maxConnection, const StringArrayPtr &allowedUpdates) const {
    vector<HttpReqArg> args;
    args.reserve(4);
    if (!url.empty()) {
        args.emplace_back("url", url);
    }
    if (certificate != nullptr) {
        args.emplace_back("certificate", certificate->data, true, certificate->mimeType, certificate->fileName);
    }
    if (maxConnection != 40) {
        args.emplace_back("max_connections", maxConnection);
    }
    if (allowedUpdates != nullptr) {
        auto allowedUpdatesJson = _tgTypeParser.parseArray<string>(
            [](const string &s)->string {
                return s;
            }, *allowedUpdates);
        args.emplace_back("allowed_updates", allowedUpdatesJson);
    }

    sendRequest("setWebhook", args);
}